

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
* active_var(map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             *__return_storage_ptr__,
            map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
            *nodes)

{
  VarId *pVVar1;
  element_type *peVar2;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *__v;
  __index_type _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  _Rb_tree_color n;
  int *piVar6;
  element_type *peVar7;
  element_type *peVar8;
  BasicBlock *b;
  bool bVar9;
  _Map_pointer ppiVar10;
  undefined1 auVar11 [8];
  int iVar12;
  _Rb_tree_header *p_Var13;
  _Base_ptr p_Var14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var15;
  variant_alternative_t<0UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar16;
  variant_alternative_t<1UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar17;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar18;
  _func_int **pp_Var19;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar20;
  mapped_type *pmVar21;
  _Base_ptr p_Var22;
  _Rb_tree_node_base *p_Var23;
  ostream *poVar24;
  _Rb_tree_node_base *p_Var25;
  ulong uVar26;
  ulong uVar27;
  uint32_t *puVar28;
  _Base_ptr p_Var29;
  uint32_t *puVar30;
  _Self __tmp_1;
  ulong uVar31;
  key_type *__k;
  ulong uVar32;
  ulong uVar33;
  _Self __tmp_4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Rb_tree_header *p_Var34;
  _Self __tmp;
  long lVar35;
  _Rb_tree_node_base *p_Var36;
  bool bVar37;
  bool bVar38;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  global;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> v;
  map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *blocks;
  vector<int,_std::allocator<int>_> visit;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  VarId s;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  out;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  in;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  def;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  use;
  undefined1 local_728 [8];
  VarId *pVStack_720;
  _Base_ptr local_718;
  _Rb_tree_node_base *local_710;
  _Rb_tree_node_base *local_708;
  size_t local_700;
  undefined1 local_6f8 [8];
  VarId *pVStack_6f0;
  VarId *local_6e8;
  _Base_ptr local_6e0;
  _Base_ptr local_6b0;
  _Rb_tree_node_base *local_6a8;
  _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>>
  *local_6a0;
  void *local_698;
  iterator iStack_690;
  int *local_688;
  undefined1 local_678 [16];
  pointer local_668;
  pointer pVStack_660;
  pointer local_658;
  _Map_pointer ppiStack_650;
  pointer local_648;
  _Elt_pointer piStack_640;
  _Elt_pointer local_638;
  _Map_pointer ppiStack_630;
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *local_620;
  undefined1 local_618 [8];
  VarId *pVStack_610;
  _Base_ptr local_608;
  ulong local_5e8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_5e0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_5c8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_5b0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_598;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_580;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_568;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_550;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_538;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_520;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_508;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4f0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4d8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4c0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4a8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_490;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_478;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_460;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_448;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_430;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_418;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_400;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_3e8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_3d0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_3b8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_3a0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_388;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_370;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_358;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_340;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_328;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_310;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_2f8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_2e0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_2c8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_2b0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_298;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_280;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_268;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_250;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_220;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_1f0;
  VarId local_1c0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_1b0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_180;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_150;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_120;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_f0;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_60;
  
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f0._M_impl.super__Rb_tree_header._M_header;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1b0._M_impl.super__Rb_tree_header._M_header;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_220._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_220._M_impl.super__Rb_tree_header._M_header;
  local_220._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_220._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_250._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_250._M_impl.super__Rb_tree_header._M_header;
  local_250._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_250._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_250._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6a0 = (_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>>
               *)__return_storage_ptr__;
  local_620 = nodes;
  local_250._M_impl.super__Rb_tree_header._M_header._M_right =
       local_250._M_impl.super__Rb_tree_header._M_header._M_left;
  local_220._M_impl.super__Rb_tree_header._M_header._M_right =
       local_220._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::_Rb_tree(&local_c0,&nodes->_M_t);
  p_Var13 = &local_c0._M_impl.super__Rb_tree_header;
  p_Var14 = &p_Var13->_M_header;
  for (; (_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_parent !=
         (_Rb_tree_header *)0x0;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&(local_c0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
           [(int)*(size_t *)(local_c0._M_impl.super__Rb_tree_header._M_header._M_parent + 1) < -1])
  {
    if (-2 < (int)*(size_t *)(local_c0._M_impl.super__Rb_tree_header._M_header._M_parent + 1)) {
      p_Var14 = local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
  }
  if (((_Rb_tree_header *)p_Var14 != p_Var13) &&
     ((int)((_Rb_tree_header *)p_Var14)->_M_node_count < 0)) {
    p_Var13 = (_Rb_tree_header *)p_Var14;
  }
  piVar6 = *(int **)(p_Var13 + 1);
  std::
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::~_Rb_tree(&local_c0);
  p_Var14 = (local_620->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_6a8 = &(local_620->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var14 != local_6a8) {
    do {
      local_6f8 = (undefined1  [8])0x0;
      pVStack_6f0 = (VarId *)0x0;
      local_6e8 = (VarId *)0x0;
      local_678._0_4_ = p_Var14[1]._M_color;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(local_678 + 8),
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
      ::
      _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                  *)&local_1f0,
                 (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)local_678);
      if ((pointer)local_678._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_678._8_8_,(long)pVStack_660 - local_678._8_8_);
      }
      local_678._0_4_ = p_Var14[1]._M_color;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(local_678 + 8),
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
      ::
      _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                  *)&local_1b0,
                 (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)local_678);
      if ((pointer)local_678._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_678._8_8_,(long)pVStack_660 - local_678._8_8_);
      }
      local_678._0_4_ = p_Var14[1]._M_color;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(local_678 + 8),
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
      ::
      _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                  *)&local_220,
                 (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)local_678);
      if ((pointer)local_678._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_678._8_8_,(long)pVStack_660 - local_678._8_8_);
      }
      local_678._0_4_ = p_Var14[1]._M_color;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(local_678 + 8),
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
      ::
      _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                  *)&local_250,
                 (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)local_678);
      if ((pointer)local_678._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_678._8_8_,(long)pVStack_660 - local_678._8_8_);
      }
      if (local_6f8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_6f8,(long)local_6e8 - (long)local_6f8);
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != local_6a8);
  }
  local_698 = (void *)0x0;
  iStack_690._M_current = (int *)0x0;
  local_688 = (int *)0x0;
  local_638 = (_Elt_pointer)0x0;
  ppiStack_630 = (_Map_pointer)0x0;
  local_648 = (pointer)0x0;
  piStack_640 = (_Elt_pointer)0x0;
  local_658 = (pointer)0x0;
  ppiStack_650 = (_Map_pointer)0x0;
  local_668 = (pointer)0x0;
  pVStack_660 = (pointer)0x0;
  local_678._0_8_ = (_Map_pointer)0x0;
  local_678._8_8_ = (pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)local_678,0);
  p_Var36 = local_6a8;
  if (iStack_690._M_current == local_688) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_698,iStack_690,piVar6);
  }
  else {
    *iStack_690._M_current = *piVar6;
    iStack_690._M_current = iStack_690._M_current + 1;
  }
  if (local_648 == (pointer)(local_638 + -1)) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)local_678,piVar6);
  }
  else {
    *(int *)&(local_648->super_Displayable)._vptr_Displayable = *piVar6;
    local_648 = (pointer)((long)&(local_648->super_Displayable)._vptr_Displayable + 4);
  }
  while (local_648 != local_668) {
    p_Var23 = (local_620->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var25 = p_Var36;
    if (p_Var23 != (_Rb_tree_node_base *)0x0) {
      iVar12 = *(int *)&(local_668->super_Displayable)._vptr_Displayable;
      do {
        if (iVar12 <= (int)p_Var23[1]._M_color) {
          p_Var25 = p_Var23;
        }
        p_Var23 = (&p_Var23->_M_left)[(int)p_Var23[1]._M_color < iVar12];
      } while (p_Var23 != (_Base_ptr)0x0);
    }
    p_Var23 = p_Var36;
    if ((p_Var25 != p_Var36) &&
       (p_Var23 = p_Var25,
       *(int *)&(local_668->super_Displayable)._vptr_Displayable < (int)p_Var25[1]._M_color)) {
      p_Var23 = p_Var36;
    }
    local_6b0 = p_Var23[1]._M_parent;
    if (local_668 == (pointer)&local_658[-1].field_0xc) {
      operator_delete(pVStack_660,0x200);
      ppiVar10 = ppiStack_650;
      ppiStack_650 = ppiStack_650 + 1;
      local_668 = (pointer)ppiVar10[1];
      pVStack_660 = local_668;
      local_658 = local_668 + 0x20;
    }
    else {
      local_668 = (pointer)((long)&(local_668->super_Displayable)._vptr_Displayable + 4);
    }
    p_Var14 = *(_Base_ptr *)(local_6b0 + 1);
    if (local_6b0[1]._M_parent != p_Var14) {
      uVar31 = 0;
      do {
        _Var15 = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (local_698,iStack_690._M_current,
                            *(undefined8 *)(&p_Var14->_M_color + uVar31 * 2));
        if (_Var15._M_current == iStack_690._M_current) {
          local_6f8 = (undefined1  [8])0x0;
          pVStack_6f0 = (VarId *)0x0;
          local_6e8 = (VarId *)0x0;
          local_718 = (_Base_ptr)0x0;
          local_728 = (undefined1  [8])0x0;
          pVStack_720 = (VarId *)0x0;
          __k = *(key_type **)(*(long *)(local_6b0 + 1) + uVar31 * 8);
          lVar35 = *(long *)(__k + 2);
          local_5e8 = uVar31;
          if (*(long *)(__k + 4) != lVar35) {
            uVar31 = 0;
            do {
              __v = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                     *)(lVar35 + uVar31 * 0x18);
              _Var3 = (__v->
                      super__Variant_base<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      ).
                      super__Move_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      .
                      super__Copy_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      .
                      super__Move_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      .
                      super__Copy_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      .
                      super__Variant_storage_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      ._M_index;
              if (_Var3 == '\x01') {
                pvVar17 = std::
                          get<1ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                                    (__v);
                peVar8 = (pvVar17->
                         super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr;
                this = (pvVar17->
                       super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this->_M_use_count = this->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this->_M_use_count = this->_M_use_count + 1;
                  }
                }
                if (peVar8->kind - Return < 2) {
                  bVar37 = (peVar8->cond_or_ret).
                           super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                           super__Optional_payload_base<mir::inst::VarId>._M_engaged;
                  if (bVar37 == true) {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_5e0,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    bVar38 = (long)local_5e0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_5e0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar38) {
                      uVar26 = (long)local_5e0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_5e0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar4 = (peVar8->cond_or_ret).
                              super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                              super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
                      if ((local_5e0.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id == uVar4)
                      goto LAB_001907e4;
                      puVar28 = &local_5e0.
                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].id;
                      uVar27 = 1;
                      do {
                        uVar33 = uVar27;
                        if (uVar26 + (uVar26 == 0) == uVar33) break;
                        uVar5 = *puVar28;
                        puVar28 = puVar28 + 4;
                        uVar27 = uVar33 + 1;
                      } while (uVar5 != uVar4);
                      bVar38 = uVar33 < uVar26;
                    }
                    if (bVar38) goto LAB_001907e4;
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_328,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_6f8);
                    bVar38 = (long)local_328.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_328.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar38) {
                      uVar26 = (long)local_328.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_328.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar4 = (peVar8->cond_or_ret).
                              super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                              super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
                      bVar38 = true;
                      if ((local_328.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                        puVar28 = &local_328.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar27 = 1;
                        do {
                          uVar33 = uVar27;
                          if (uVar26 + (uVar26 == 0) == uVar33) break;
                          uVar5 = *puVar28;
                          puVar28 = puVar28 + 4;
                          uVar27 = uVar33 + 1;
                        } while (uVar5 != uVar4);
                        bVar38 = uVar33 < uVar26;
                      }
                    }
                    bVar38 = (bool)(bVar38 ^ 1);
                    bVar9 = true;
                  }
                  else {
LAB_001907e4:
                    bVar9 = false;
                    bVar38 = false;
                  }
                  if ((bVar9) &&
                     (local_328.
                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                    operator_delete(local_328.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_328.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_328.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((bVar37 != false) &&
                     (local_5e0.
                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                    operator_delete(local_5e0.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_5e0.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_5e0.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (bVar38) {
                    if ((_Base_ptr)pVStack_720 == local_718) {
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_728,(iterator)pVStack_720,(VarId *)&peVar8->cond_or_ret);
                    }
                    else {
                      (pVStack_720->super_Displayable)._vptr_Displayable =
                           (_func_int **)&PTR_display_001ee058;
                      pVStack_720->id =
                           (peVar8->cond_or_ret).
                           super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                           super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
                      pVStack_720 = pVStack_720 + 1;
                    }
                  }
                }
                if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001921fa;
LAB_001921f2:
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
              else if (_Var3 == '\0') {
                pvVar16 = std::
                          get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                                    (__v);
                peVar7 = (pvVar16->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
                this = (pvVar16->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this->_M_use_count = this->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this->_M_use_count = this->_M_use_count + 1;
                  }
                }
                iVar12 = (*(peVar7->super_Displayable)._vptr_Displayable[1])(peVar7);
                if (iVar12 == 0) {
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      this->_M_use_count = this->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      this->_M_use_count = this->_M_use_count + 1;
                    }
                  }
                  if (*(char *)&peVar7[2].super_Displayable._vptr_Displayable == '\x01') {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_3a0,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    pVVar1 = &peVar7[1].dest;
                    pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)pVVar1);
                    bVar37 = (long)local_3a0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_3a0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar37) {
                      uVar26 = (long)local_3a0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_3a0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      bVar37 = true;
                      if ((local_3a0.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                        puVar28 = &local_3a0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar27 = 1;
                        do {
                          uVar33 = uVar27;
                          if (uVar26 + (uVar26 == 0) == uVar33) break;
                          uVar4 = *puVar28;
                          puVar28 = puVar28 + 4;
                          uVar27 = uVar33 + 1;
                        } while (uVar4 != pvVar18->id);
                        bVar37 = uVar33 < uVar26;
                      }
                    }
                    if (bVar37) {
                      bVar38 = false;
                    }
                    else {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_3b8,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_6f8);
                      pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)pVVar1);
                      bVar38 = (long)local_3b8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_3b8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar38) {
                        uVar26 = (long)local_3b8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_3b8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        bVar38 = true;
                        if ((local_3b8.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                          puVar28 = &local_3b8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar4 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar4 != pvVar18->id);
                          bVar38 = uVar33 < uVar26;
                        }
                      }
                      bVar38 = (bool)(bVar38 ^ 1);
                    }
                    if ((!bVar37) &&
                       (local_3b8.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(local_3b8.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_3b8.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_3b8.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_3a0.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_3a0.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_3a0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_3a0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (bVar38) {
                      pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)pVVar1);
                      local_618 = (undefined1  [8])&PTR_display_001ee058;
                      uVar4 = pvVar18->id;
                      pVStack_610 = (VarId *)CONCAT44(pVStack_610._4_4_,uVar4);
                      if ((_Base_ptr)pVStack_720 == local_718) {
                        std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                        _M_realloc_insert<mir::inst::VarId_const&>
                                  ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                   local_728,(iterator)pVStack_720,(VarId *)local_618);
                      }
                      else {
                        (pVStack_720->super_Displayable)._vptr_Displayable =
                             (_func_int **)&PTR_display_001ee058;
                        pVStack_720->id = uVar4;
                        pVStack_720 = pVStack_720 + 1;
                      }
                    }
                  }
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            (&local_3d0,
                             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             local_728);
                  bVar37 = (long)local_3d0.
                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_3d0.
                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                 ._M_impl.super__Vector_impl_data._M_start != 0;
                  if (bVar37) {
                    uVar26 = (long)local_3d0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_3d0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4;
                    uVar4 = (peVar7->dest).id;
                    bVar37 = true;
                    if ((local_3d0.
                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                         _M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                      puVar28 = &local_3d0.
                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].id;
                      uVar27 = 1;
                      do {
                        uVar33 = uVar27;
                        if (uVar26 + (uVar26 == 0) == uVar33) break;
                        uVar5 = *puVar28;
                        puVar28 = puVar28 + 4;
                        uVar27 = uVar33 + 1;
                      } while (uVar5 != uVar4);
                      bVar37 = uVar33 < uVar26;
                    }
                  }
                  if (bVar37) {
                    bVar38 = false;
                  }
                  else {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_268,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_6f8);
                    bVar38 = (long)local_268.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_268.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar38) {
                      uVar26 = (long)local_268.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_268.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar4 = (peVar7->dest).id;
                      bVar38 = true;
                      if ((local_268.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                        puVar28 = &local_268.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar27 = 1;
                        do {
                          uVar33 = uVar27;
                          if (uVar26 + (uVar26 == 0) == uVar33) break;
                          uVar5 = *puVar28;
                          puVar28 = puVar28 + 4;
                          uVar27 = uVar33 + 1;
                        } while (uVar5 != uVar4);
                        bVar38 = uVar33 < uVar26;
                      }
                    }
                    bVar38 = (bool)(bVar38 ^ 1);
                  }
                  if ((!bVar37) &&
                     (local_268.
                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                    operator_delete(local_268.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_268.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_268.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_3d0.
                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_3d0.
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_3d0.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_3d0.
                                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  p_Var36 = local_6a8;
                  if (bVar38) {
                    if (pVStack_6f0 == local_6e8) {
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_6f8,(iterator)pVStack_6f0,&peVar7->dest);
                    }
                    else {
LAB_001921c2:
                      (pVStack_6f0->super_Displayable)._vptr_Displayable =
                           (_func_int **)&PTR_display_001ee058;
                      pVStack_6f0->id = (peVar7->dest).id;
                      pVStack_6f0 = pVStack_6f0 + 1;
                    }
                  }
LAB_001921db:
                  if (this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                  goto LAB_001921fa;
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                }
                else {
                  iVar12 = (*(peVar7->super_Displayable)._vptr_Displayable[1])(peVar7);
                  if (iVar12 == 1) {
                    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        this->_M_use_count = this->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        this->_M_use_count = this->_M_use_count + 1;
                      }
                    }
                    if (*(char *)&peVar7[2].super_Displayable._vptr_Displayable == '\x01') {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_3e8,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_728);
                      pVVar1 = &peVar7[1].dest;
                      pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)pVVar1);
                      bVar37 = (long)local_3e8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_3e8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar37) {
                        uVar26 = (long)local_3e8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_3e8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        bVar37 = true;
                        if ((local_3e8.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                          puVar28 = &local_3e8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar4 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar4 != pvVar18->id);
                          bVar37 = uVar33 < uVar26;
                        }
                      }
                      if (bVar37) {
                        bVar38 = false;
                      }
                      else {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (&local_400,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   local_6f8);
                        pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)pVVar1);
                        bVar38 = (long)local_400.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_400.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start != 0;
                        if (bVar38) {
                          uVar26 = (long)local_400.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_400.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4;
                          bVar38 = true;
                          if ((local_400.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                            puVar28 = &local_400.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].id;
                            uVar27 = 1;
                            do {
                              uVar33 = uVar27;
                              if (uVar26 + (uVar26 == 0) == uVar33) break;
                              uVar4 = *puVar28;
                              puVar28 = puVar28 + 4;
                              uVar27 = uVar33 + 1;
                            } while (uVar4 != pvVar18->id);
                            bVar38 = uVar33 < uVar26;
                          }
                        }
                        bVar38 = (bool)(bVar38 ^ 1);
                      }
                      if ((!bVar37) &&
                         (local_400.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                        operator_delete(local_400.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_400.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_400.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_3e8.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_3e8.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_3e8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_3e8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar38) {
                        pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)pVVar1);
                        if ((_Base_ptr)pVStack_720 == local_718) {
                          std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                          _M_realloc_insert<mir::inst::VarId_const&>
                                    ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                     local_728,(iterator)pVStack_720,pvVar18);
                        }
                        else {
                          (pVStack_720->super_Displayable)._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          pVStack_720->id = pvVar18->id;
                          pVStack_720 = pVStack_720 + 1;
                        }
                      }
                    }
                    if (*(char *)&peVar7[3].dest.super_Displayable._vptr_Displayable == '\x01') {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_418,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_728);
                      puVar28 = &peVar7[2].dest.id;
                      pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)puVar28);
                      bVar37 = (long)local_418.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_418.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar37) {
                        uVar26 = (long)local_418.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_418.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        bVar37 = true;
                        if ((local_418.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                          puVar30 = &local_418.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar4 = *puVar30;
                            puVar30 = puVar30 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar4 != pvVar18->id);
                          bVar37 = uVar33 < uVar26;
                        }
                      }
                      if (bVar37) {
                        bVar38 = false;
                      }
                      else {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (&local_430,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   local_6f8);
                        pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)puVar28);
                        bVar38 = (long)local_430.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_430.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start != 0;
                        if (bVar38) {
                          uVar26 = (long)local_430.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_430.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4;
                          bVar38 = true;
                          if ((local_430.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                            puVar30 = &local_430.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].id;
                            uVar27 = 1;
                            do {
                              uVar33 = uVar27;
                              if (uVar26 + (uVar26 == 0) == uVar33) break;
                              uVar4 = *puVar30;
                              puVar30 = puVar30 + 4;
                              uVar27 = uVar33 + 1;
                            } while (uVar4 != pvVar18->id);
                            bVar38 = uVar33 < uVar26;
                          }
                        }
                        bVar38 = (bool)(bVar38 ^ 1);
                      }
                      if ((!bVar37) &&
                         (local_430.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                        operator_delete(local_430.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_430.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_430.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_418.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_418.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_418.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_418.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar38) {
                        pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)puVar28);
                        if ((_Base_ptr)pVStack_720 == local_718) {
                          std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                          _M_realloc_insert<mir::inst::VarId_const&>
                                    ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                     local_728,(iterator)pVStack_720,pvVar18);
                        }
                        else {
                          (pVStack_720->super_Displayable)._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          pVStack_720->id = pvVar18->id;
                          pVStack_720 = pVStack_720 + 1;
                        }
                      }
                    }
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_448,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    bVar37 = (long)local_448.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_448.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar37) {
                      uVar26 = (long)local_448.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_448.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar4 = (peVar7->dest).id;
                      bVar37 = true;
                      if ((local_448.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                        puVar28 = &local_448.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar27 = 1;
                        do {
                          uVar33 = uVar27;
                          if (uVar26 + (uVar26 == 0) == uVar33) break;
                          uVar5 = *puVar28;
                          puVar28 = puVar28 + 4;
                          uVar27 = uVar33 + 1;
                        } while (uVar5 != uVar4);
                        bVar37 = uVar33 < uVar26;
                      }
                    }
                    if (bVar37) {
                      bVar38 = false;
                    }
                    else {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_280,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_6f8);
                      bVar38 = (long)local_280.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_280.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar38) {
                        uVar26 = (long)local_280.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_280.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        uVar4 = (peVar7->dest).id;
                        bVar38 = true;
                        if ((local_280.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                          puVar28 = &local_280.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar5 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar5 != uVar4);
                          bVar38 = uVar33 < uVar26;
                        }
                      }
                      bVar38 = (bool)(bVar38 ^ 1);
                    }
                    if ((!bVar37) &&
                       (local_280.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(local_280.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_280.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_280.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_448.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_448.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_448.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_448.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    p_Var36 = local_6a8;
                    if (bVar38) {
                      if (pVStack_6f0 != local_6e8) goto LAB_001921c2;
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_6f8,(iterator)pVStack_6f0,&peVar7->dest);
                    }
                    goto LAB_001921db;
                  }
                  iVar12 = (*(peVar7->super_Displayable)._vptr_Displayable[1])(peVar7);
                  if (iVar12 == 6) {
                    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        this->_M_use_count = this->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        this->_M_use_count = this->_M_use_count + 1;
                      }
                    }
                    pp_Var19 = peVar7[2].dest.super_Displayable._vptr_Displayable;
                    if (*(_func_int ***)&peVar7[2].dest.id != pp_Var19) {
                      uVar26 = 0;
                      do {
                        if (*(char *)(pp_Var19 + uVar26 * 4 + 3) == '\x01') {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    (&local_460,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     local_728);
                          pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                              ((variant<int,_mir::inst::VarId> *)
                                               (peVar7[2].dest.super_Displayable._vptr_Displayable +
                                               uVar26 * 4 + 1));
                          bVar37 = (long)local_460.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_460.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start != 0;
                          if (bVar37) {
                            uVar27 = (long)local_460.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_460.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4;
                            bVar37 = true;
                            if ((local_460.
                                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                              puVar28 = &local_460.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1].id;
                              uVar33 = 1;
                              do {
                                uVar32 = uVar33;
                                if (uVar27 + (uVar27 == 0) == uVar32) break;
                                uVar4 = *puVar28;
                                puVar28 = puVar28 + 4;
                                uVar33 = uVar32 + 1;
                              } while (uVar4 != pvVar18->id);
                              bVar37 = uVar32 < uVar27;
                            }
                          }
                          if (bVar37) {
                            bVar38 = false;
                          }
                          else {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      (&local_478,
                                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)local_6f8);
                            pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 (peVar7[2].dest.super_Displayable._vptr_Displayable
                                                 + uVar26 * 4 + 1));
                            bVar38 = (long)local_478.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_478.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start != 0;
                            if (bVar38) {
                              uVar27 = (long)local_478.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_478.
                                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4;
                              bVar38 = true;
                              if ((local_478.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                                puVar28 = &local_478.
                                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].id;
                                uVar33 = 1;
                                do {
                                  uVar32 = uVar33;
                                  if (uVar27 + (uVar27 == 0) == uVar32) break;
                                  uVar4 = *puVar28;
                                  puVar28 = puVar28 + 4;
                                  uVar33 = uVar32 + 1;
                                } while (uVar4 != pvVar18->id);
                                bVar38 = uVar32 < uVar27;
                              }
                            }
                            bVar38 = (bool)(bVar38 ^ 1);
                          }
                          if ((!bVar37) &&
                             (local_478.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                            operator_delete(local_478.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_478.
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_478.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_460.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_460.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_460.
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_460.
                                                                                                        
                                                  super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (bVar38) {
                            pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 (peVar7[2].dest.super_Displayable._vptr_Displayable
                                                 + uVar26 * 4 + 1));
                            local_618 = (undefined1  [8])&PTR_display_001ee058;
                            uVar4 = pvVar18->id;
                            pVStack_610 = (VarId *)CONCAT44(pVStack_610._4_4_,uVar4);
                            if ((_Base_ptr)pVStack_720 == local_718) {
                              std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                              _M_realloc_insert<mir::inst::VarId_const&>
                                        ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>
                                          *)local_728,(iterator)pVStack_720,(VarId *)local_618);
                            }
                            else {
                              (pVStack_720->super_Displayable)._vptr_Displayable =
                                   (_func_int **)&PTR_display_001ee058;
                              pVStack_720->id = uVar4;
                              pVStack_720 = pVStack_720 + 1;
                            }
                          }
                        }
                        uVar26 = uVar26 + 1;
                        pp_Var19 = peVar7[2].dest.super_Displayable._vptr_Displayable;
                      } while (uVar26 < (ulong)(*(long *)&peVar7[2].dest.id - (long)pp_Var19 >> 5));
                    }
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_490,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    bVar37 = (long)local_490.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_490.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar37) {
                      uVar26 = (long)local_490.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_490.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar4 = (peVar7->dest).id;
                      bVar37 = true;
                      if ((local_490.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                        puVar28 = &local_490.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar27 = 1;
                        do {
                          uVar33 = uVar27;
                          if (uVar26 + (uVar26 == 0) == uVar33) break;
                          uVar5 = *puVar28;
                          puVar28 = puVar28 + 4;
                          uVar27 = uVar33 + 1;
                        } while (uVar5 != uVar4);
                        bVar37 = uVar33 < uVar26;
                      }
                    }
                    if (bVar37) {
                      bVar38 = false;
                    }
                    else {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_298,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_6f8);
                      bVar38 = (long)local_298.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_298.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar38) {
                        uVar26 = (long)local_298.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_298.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        uVar4 = (peVar7->dest).id;
                        bVar38 = true;
                        if ((local_298.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                          puVar28 = &local_298.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar5 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar5 != uVar4);
                          bVar38 = uVar33 < uVar26;
                        }
                      }
                      bVar38 = (bool)(bVar38 ^ 1);
                    }
                    if ((!bVar37) &&
                       (local_298.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(local_298.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_298.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_298.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_490.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_490.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_490.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_490.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    p_Var36 = local_6a8;
                    if (bVar38) {
                      if (pVStack_6f0 != local_6e8) goto LAB_001921c2;
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_6f8,(iterator)pVStack_6f0,&peVar7->dest);
                    }
                    goto LAB_001921db;
                  }
                  iVar12 = (*(peVar7->super_Displayable)._vptr_Displayable[1])(peVar7);
                  if (iVar12 == 2) {
                    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        this->_M_use_count = this->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        this->_M_use_count = this->_M_use_count + 1;
                      }
                    }
                    if (*(char *)&peVar7[2].dest.super_Displayable._vptr_Displayable == '\0') {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_4a8,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_728);
                      peVar2 = peVar7 + 1;
                      pvVar20 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                          ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)peVar2);
                      bVar37 = (long)local_4a8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_4a8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar37) {
                        uVar26 = (long)local_4a8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_4a8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        bVar37 = true;
                        if ((local_4a8.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != pvVar20->id) {
                          puVar28 = &local_4a8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar4 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar4 != pvVar20->id);
                          bVar37 = uVar33 < uVar26;
                        }
                      }
                      if (bVar37) {
                        bVar38 = false;
                      }
                      else {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (&local_4c0,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   local_6f8);
                        pvVar20 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                            ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)peVar2);
                        bVar38 = (long)local_4c0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_4c0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start != 0;
                        if (bVar38) {
                          uVar26 = (long)local_4c0.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_4c0.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4;
                          bVar38 = true;
                          if ((local_4c0.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start)->id != pvVar20->id) {
                            puVar28 = &local_4c0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].id;
                            uVar27 = 1;
                            do {
                              uVar33 = uVar27;
                              if (uVar26 + (uVar26 == 0) == uVar33) break;
                              uVar4 = *puVar28;
                              puVar28 = puVar28 + 4;
                              uVar27 = uVar33 + 1;
                            } while (uVar4 != pvVar20->id);
                            bVar38 = uVar33 < uVar26;
                          }
                        }
                        bVar38 = (bool)(bVar38 ^ 1);
                      }
                      if ((!bVar37) &&
                         (local_4c0.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                        operator_delete(local_4c0.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_4c0.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_4c0.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_4a8.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_4a8.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_4a8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_4a8.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar38) {
                        pvVar20 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                            ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)peVar2);
                        if ((_Base_ptr)pVStack_720 == local_718) {
                          std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                          _M_realloc_insert<mir::inst::VarId_const&>
                                    ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                     local_728,(iterator)pVStack_720,pvVar20);
                        }
                        else {
                          (pVStack_720->super_Displayable)._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          pVStack_720->id = pvVar20->id;
                          pVStack_720 = pVStack_720 + 1;
                        }
                      }
                    }
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_4d8,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    bVar37 = (long)local_4d8.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_4d8.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar37) {
                      uVar26 = (long)local_4d8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_4d8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar4 = (peVar7->dest).id;
                      bVar37 = true;
                      if ((local_4d8.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                        puVar28 = &local_4d8.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar27 = 1;
                        do {
                          uVar33 = uVar27;
                          if (uVar26 + (uVar26 == 0) == uVar33) break;
                          uVar5 = *puVar28;
                          puVar28 = puVar28 + 4;
                          uVar27 = uVar33 + 1;
                        } while (uVar5 != uVar4);
                        bVar37 = uVar33 < uVar26;
                      }
                    }
                    if (bVar37) {
                      bVar38 = false;
                    }
                    else {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_2b0,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_6f8);
                      bVar38 = (long)local_2b0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2b0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar38) {
                        uVar26 = (long)local_2b0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2b0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        uVar4 = (peVar7->dest).id;
                        bVar38 = true;
                        if ((local_2b0.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                          puVar28 = &local_2b0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar5 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar5 != uVar4);
                          bVar38 = uVar33 < uVar26;
                        }
                      }
                      bVar38 = (bool)(bVar38 ^ 1);
                    }
                    if ((!bVar37) &&
                       (local_2b0.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(local_2b0.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_2b0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_2b0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_4d8.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_4d8.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_4d8.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_4d8.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (bVar38) {
                      if (pVStack_6f0 != local_6e8) goto LAB_001921c2;
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_6f8,(iterator)pVStack_6f0,&peVar7->dest);
                    }
                    goto LAB_001921db;
                  }
                  iVar12 = (*(peVar7->super_Displayable)._vptr_Displayable[1])(peVar7);
                  if (iVar12 == 3) {
                    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        this->_M_use_count = this->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        this->_M_use_count = this->_M_use_count + 1;
                      }
                    }
                    if (*(char *)&peVar7[2].super_Displayable._vptr_Displayable == '\x01') {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_4f0,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_728);
                      pVVar1 = &peVar7[1].dest;
                      pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)pVVar1);
                      bVar37 = (long)local_4f0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_4f0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar37) {
                        uVar26 = (long)local_4f0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_4f0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        bVar37 = true;
                        if ((local_4f0.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                          puVar28 = &local_4f0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar4 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar4 != pvVar18->id);
                          bVar37 = uVar33 < uVar26;
                        }
                      }
                      if (bVar37) {
                        bVar38 = false;
                      }
                      else {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (&local_508,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   local_6f8);
                        pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)pVVar1);
                        bVar38 = (long)local_508.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_508.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start != 0;
                        if (bVar38) {
                          uVar26 = (long)local_508.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_508.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4;
                          bVar38 = true;
                          if ((local_508.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                            puVar28 = &local_508.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].id;
                            uVar27 = 1;
                            do {
                              uVar33 = uVar27;
                              if (uVar26 + (uVar26 == 0) == uVar33) break;
                              uVar4 = *puVar28;
                              puVar28 = puVar28 + 4;
                              uVar27 = uVar33 + 1;
                            } while (uVar4 != pvVar18->id);
                            bVar38 = uVar33 < uVar26;
                          }
                        }
                        bVar38 = (bool)(bVar38 ^ 1);
                      }
                      if ((!bVar37) &&
                         (local_508.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                        operator_delete(local_508.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_508.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_508.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_4f0.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_4f0.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_4f0.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_4f0.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar38) {
                        pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)pVVar1);
                        if ((_Base_ptr)pVStack_720 == local_718) {
                          std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                          _M_realloc_insert<mir::inst::VarId_const&>
                                    ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                     local_728,(iterator)pVStack_720,pvVar18);
                        }
                        else {
                          (pVStack_720->super_Displayable)._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          pVStack_720->id = pvVar18->id;
                          pVStack_720 = pVStack_720 + 1;
                        }
                      }
                    }
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_520,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    bVar37 = (long)local_520.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_520.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar37) {
                      uVar26 = (long)local_520.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_520.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar4 = (peVar7->dest).id;
                      bVar37 = true;
                      if ((local_520.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                        puVar28 = &local_520.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar27 = 1;
                        do {
                          uVar33 = uVar27;
                          if (uVar26 + (uVar26 == 0) == uVar33) break;
                          uVar5 = *puVar28;
                          puVar28 = puVar28 + 4;
                          uVar27 = uVar33 + 1;
                        } while (uVar5 != uVar4);
                        bVar37 = uVar33 < uVar26;
                      }
                    }
                    if (bVar37) {
                      bVar38 = false;
                    }
                    else {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_2c8,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_6f8);
                      bVar38 = (long)local_2c8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2c8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar38) {
                        uVar26 = (long)local_2c8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2c8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        uVar4 = (peVar7->dest).id;
                        bVar38 = true;
                        if ((local_2c8.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                          puVar28 = &local_2c8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar5 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar5 != uVar4);
                          bVar38 = uVar33 < uVar26;
                        }
                      }
                      bVar38 = (bool)(bVar38 ^ 1);
                    }
                    if ((!bVar37) &&
                       (local_2c8.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(local_2c8.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_2c8.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_2c8.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_520.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_520.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_520.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_520.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (bVar38) {
                      if (pVStack_6f0 != local_6e8) goto LAB_001921c2;
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_6f8,(iterator)pVStack_6f0,&peVar7->dest);
                    }
                    goto LAB_001921db;
                  }
                  iVar12 = (*(peVar7->super_Displayable)._vptr_Displayable[1])(peVar7);
                  if (iVar12 == 4) {
                    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        this->_M_use_count = this->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        this->_M_use_count = this->_M_use_count + 1;
                      }
                    }
                    if (*(char *)&peVar7[2].super_Displayable._vptr_Displayable == '\x01') {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_538,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_728);
                      pVVar1 = &peVar7[1].dest;
                      pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)pVVar1);
                      bVar37 = (long)local_538.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_538.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar37) {
                        uVar26 = (long)local_538.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_538.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        bVar37 = true;
                        if ((local_538.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                          puVar28 = &local_538.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar4 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar4 != pvVar18->id);
                          bVar37 = uVar33 < uVar26;
                        }
                      }
                      if (bVar37) {
                        bVar38 = false;
                      }
                      else {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (&local_550,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   local_6f8);
                        pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)pVVar1);
                        bVar38 = (long)local_550.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_550.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start != 0;
                        if (bVar38) {
                          uVar26 = (long)local_550.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_550.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4;
                          bVar38 = true;
                          if ((local_550.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                            puVar28 = &local_550.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].id;
                            uVar27 = 1;
                            do {
                              uVar33 = uVar27;
                              if (uVar26 + (uVar26 == 0) == uVar33) break;
                              uVar4 = *puVar28;
                              puVar28 = puVar28 + 4;
                              uVar27 = uVar33 + 1;
                            } while (uVar4 != pvVar18->id);
                            bVar38 = uVar33 < uVar26;
                          }
                        }
                        bVar38 = (bool)(bVar38 ^ 1);
                      }
                      if ((!bVar37) &&
                         (local_550.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                        operator_delete(local_550.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_550.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_550.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_538.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_538.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_538.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_538.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar38) {
                        pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)pVVar1);
                        if ((_Base_ptr)pVStack_720 == local_718) {
                          std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                          _M_realloc_insert<mir::inst::VarId_const&>
                                    ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                     local_728,(iterator)pVStack_720,pvVar18);
                        }
                        else {
                          (pVStack_720->super_Displayable)._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          pVStack_720->id = pvVar18->id;
                          pVStack_720 = pVStack_720 + 1;
                        }
                      }
                    }
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_568,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    bVar37 = (long)local_568.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_568.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar37) {
                      uVar26 = (long)local_568.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_568.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar4 = (peVar7->dest).id;
                      bVar37 = true;
                      if ((local_568.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                        puVar28 = &local_568.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar27 = 1;
                        do {
                          uVar33 = uVar27;
                          if (uVar26 + (uVar26 == 0) == uVar33) break;
                          uVar5 = *puVar28;
                          puVar28 = puVar28 + 4;
                          uVar27 = uVar33 + 1;
                        } while (uVar5 != uVar4);
                        bVar37 = uVar33 < uVar26;
                      }
                    }
                    if (bVar37) {
                      bVar38 = false;
                    }
                    else {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_2e0,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_6f8);
                      bVar38 = (long)local_2e0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2e0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar38) {
                        uVar26 = (long)local_2e0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2e0.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        uVar4 = (peVar7->dest).id;
                        bVar38 = true;
                        if ((local_2e0.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                          puVar28 = &local_2e0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar5 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar5 != uVar4);
                          bVar38 = uVar33 < uVar26;
                        }
                      }
                      bVar38 = (bool)(bVar38 ^ 1);
                    }
                    if ((!bVar37) &&
                       (local_2e0.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(local_2e0.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_2e0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_2e0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_568.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_568.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_568.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_568.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (bVar38) {
                      if (pVStack_6f0 != local_6e8) goto LAB_001921c2;
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_6f8,(iterator)pVStack_6f0,&peVar7->dest);
                    }
                    goto LAB_001921db;
                  }
                  iVar12 = (*(peVar7->super_Displayable)._vptr_Displayable[1])(peVar7);
                  if (iVar12 == 5) {
                    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        this->_M_use_count = this->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        this->_M_use_count = this->_M_use_count + 1;
                      }
                    }
                    if ((char)peVar7[2].dest.id == '\x01') {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_580,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_728);
                      peVar2 = peVar7 + 2;
                      pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)peVar2);
                      bVar37 = (long)local_580.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_580.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar37) {
                        uVar26 = (long)local_580.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_580.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        bVar37 = true;
                        if ((local_580.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                          puVar28 = &local_580.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar4 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar4 != pvVar18->id);
                          bVar37 = uVar33 < uVar26;
                        }
                      }
                      if (bVar37) {
                        bVar38 = false;
                      }
                      else {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  (&local_598,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   local_6f8);
                        pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)peVar2);
                        bVar38 = (long)local_598.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_598.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start != 0;
                        if (bVar38) {
                          uVar26 = (long)local_598.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_598.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4;
                          bVar38 = true;
                          if ((local_598.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start)->id != pvVar18->id) {
                            puVar28 = &local_598.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].id;
                            uVar27 = 1;
                            do {
                              uVar33 = uVar27;
                              if (uVar26 + (uVar26 == 0) == uVar33) break;
                              uVar4 = *puVar28;
                              puVar28 = puVar28 + 4;
                              uVar27 = uVar33 + 1;
                            } while (uVar4 != pvVar18->id);
                            bVar38 = uVar33 < uVar26;
                          }
                        }
                        bVar38 = (bool)(bVar38 ^ 1);
                      }
                      if ((!bVar37) &&
                         (local_598.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                        operator_delete(local_598.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_598.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_598.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_580.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_580.
                                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_580.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_580.
                                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (bVar38) {
                        pvVar18 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)peVar2);
                        if ((_Base_ptr)pVStack_720 == local_718) {
                          std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                          _M_realloc_insert<mir::inst::VarId_const&>
                                    ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                     local_728,(iterator)pVStack_720,pvVar18);
                        }
                        else {
                          (pVStack_720->super_Displayable)._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          pVStack_720->id = pvVar18->id;
                          pVStack_720 = pVStack_720 + 1;
                        }
                      }
                    }
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_5b0,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    bVar37 = (long)local_5b0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_5b0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar37) {
                      uVar26 = (long)local_5b0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_5b0.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar4 = *(uint32_t *)&peVar7[1].dest.super_Displayable._vptr_Displayable;
                      bVar37 = true;
                      if ((local_5b0.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                        puVar28 = &local_5b0.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar27 = 1;
                        do {
                          uVar33 = uVar27;
                          if (uVar26 + (uVar26 == 0) == uVar33) break;
                          uVar5 = *puVar28;
                          puVar28 = puVar28 + 4;
                          uVar27 = uVar33 + 1;
                        } while (uVar5 != uVar4);
                        bVar37 = uVar33 < uVar26;
                      }
                    }
                    if (bVar37) {
                      bVar38 = false;
                    }
                    else {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_2f8,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_6f8);
                      bVar38 = (long)local_2f8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2f8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar38) {
                        uVar26 = (long)local_2f8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2f8.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        uVar4 = *(uint32_t *)&peVar7[1].dest.super_Displayable._vptr_Displayable;
                        bVar38 = true;
                        if ((local_2f8.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                          puVar28 = &local_2f8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar5 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar5 != uVar4);
                          bVar38 = uVar33 < uVar26;
                        }
                      }
                      bVar38 = (bool)(bVar38 ^ 1);
                    }
                    if ((!bVar37) &&
                       (local_2f8.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(local_2f8.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_2f8.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_2f8.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_5b0.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_5b0.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_5b0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_5b0.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (bVar38) {
                      if ((_Base_ptr)pVStack_720 == local_718) {
                        std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                        _M_realloc_insert<mir::inst::VarId_const&>
                                  ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                   local_728,(iterator)pVStack_720,(VarId *)(peVar7 + 1));
                      }
                      else {
                        (pVStack_720->super_Displayable)._vptr_Displayable =
                             (_func_int **)&PTR_display_001ee058;
                        pVStack_720->id =
                             *(uint32_t *)&peVar7[1].dest.super_Displayable._vptr_Displayable;
                        pVStack_720 = pVStack_720 + 1;
                      }
                    }
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              (&local_5c8,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               local_728);
                    bVar37 = (long)local_5c8.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_5c8.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start != 0;
                    if (bVar37) {
                      uVar26 = (long)local_5c8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_5c8.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      uVar4 = (peVar7->dest).id;
                      bVar37 = true;
                      if ((local_5c8.
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                           _M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                        puVar28 = &local_5c8.
                                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].id;
                        uVar27 = 1;
                        do {
                          uVar33 = uVar27;
                          if (uVar26 + (uVar26 == 0) == uVar33) break;
                          uVar5 = *puVar28;
                          puVar28 = puVar28 + 4;
                          uVar27 = uVar33 + 1;
                        } while (uVar5 != uVar4);
                        bVar37 = uVar33 < uVar26;
                      }
                    }
                    if (bVar37) {
                      bVar38 = false;
                    }
                    else {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                (&local_310,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 local_6f8);
                      bVar38 = (long)local_310.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_310.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start != 0;
                      if (bVar38) {
                        uVar26 = (long)local_310.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_310.
                                       super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4;
                        uVar4 = (peVar7->dest).id;
                        bVar38 = true;
                        if ((local_310.
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id != uVar4) {
                          puVar28 = &local_310.
                                     super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].id;
                          uVar27 = 1;
                          do {
                            uVar33 = uVar27;
                            if (uVar26 + (uVar26 == 0) == uVar33) break;
                            uVar5 = *puVar28;
                            puVar28 = puVar28 + 4;
                            uVar27 = uVar33 + 1;
                          } while (uVar5 != uVar4);
                          bVar38 = uVar33 < uVar26;
                        }
                      }
                      bVar38 = (bool)(bVar38 ^ 1);
                    }
                    if ((!bVar37) &&
                       (local_310.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(local_310.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_310.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_310.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_5c8.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_5c8.
                                      super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_5c8.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_5c8.
                                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (bVar38) {
                      if (pVStack_6f0 != local_6e8) goto LAB_001921c2;
                      std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                      _M_realloc_insert<mir::inst::VarId_const&>
                                ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                                 local_6f8,(iterator)pVStack_6f0,&peVar7->dest);
                    }
                    goto LAB_001921db;
                  }
                }
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001921f2;
              }
LAB_001921fa:
              uVar31 = uVar31 + 1;
              __k = *(key_type **)(*(long *)(local_6b0 + 1) + local_5e8 * 8);
              lVar35 = *(long *)(__k + 2);
              uVar26 = (*(long *)(__k + 4) - lVar35 >> 3) * -0x5555555555555555;
            } while (uVar31 <= uVar26 && uVar26 - uVar31 != 0);
          }
          pmVar21 = std::
                    map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[]((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                                  *)&local_1f0,__k);
          uVar31 = local_5e8;
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                    (pmVar21,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             local_6f8);
          pmVar21 = std::
                    map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[]((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                                  *)&local_1b0,*(key_type **)(*(long *)(local_6b0 + 1) + uVar31 * 8)
                                );
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                    (pmVar21,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             local_728);
          piVar6 = *(int **)(*(long *)(local_6b0 + 1) + uVar31 * 8);
          if (iStack_690._M_current == local_688) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_698,iStack_690,piVar6);
          }
          else {
            *iStack_690._M_current = *piVar6;
            iStack_690._M_current = iStack_690._M_current + 1;
          }
          piVar6 = *(int **)(*(long *)(local_6b0 + 1) + uVar31 * 8);
          if (local_648 == (pointer)(local_638 + -1)) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)local_678,piVar6);
          }
          else {
            *(int *)&(local_648->super_Displayable)._vptr_Displayable = *piVar6;
            local_648 = (pointer)((long)&(local_648->super_Displayable)._vptr_Displayable + 4);
          }
          if (local_728 != (undefined1  [8])0x0) {
            operator_delete((void *)local_728,(long)local_718 - (long)local_728);
          }
          if (local_6f8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_6f8,(long)local_6e8 - (long)local_6f8);
          }
        }
        uVar31 = uVar31 + 1;
        p_Var14 = *(_Base_ptr *)(local_6b0 + 1);
      } while (uVar31 < (ulong)((long)local_6b0[1]._M_parent - (long)p_Var14 >> 3));
    }
  }
  do {
    p_Var23 = (local_620->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var23 == p_Var36) break;
    bVar37 = false;
    do {
      b = (BasicBlock *)p_Var23[1]._M_parent;
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::_Rb_tree(&local_f0,&local_220);
      calcu_out((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8,b,
                (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                 *)&local_f0);
      p_Var36 = p_Var23 + 1;
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&local_f0);
      pmVar21 = std::
                map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                ::operator[]((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                              *)&local_250,(key_type *)p_Var36);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                (pmVar21,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_6f8);
      n = p_Var36->_M_color;
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::_Rb_tree(&local_120,&local_1b0);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::_Rb_tree(&local_150,&local_250);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::_Rb_tree(&local_180,&local_1f0);
      calcu_in((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_728,n,
               (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)&local_120,
               (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)&local_150,
               (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)&local_180);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&local_180);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&local_150);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&local_120);
      p_Var14 = &local_220._M_impl.super__Rb_tree_header._M_header;
      if (local_220._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var22 = local_220._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if ((int)p_Var36->_M_color <= (int)*(size_t *)(p_Var22 + 1)) {
            p_Var14 = p_Var22;
          }
          p_Var22 = (&p_Var22->_M_left)[(int)*(size_t *)(p_Var22 + 1) < (int)p_Var36->_M_color];
        } while (p_Var22 != (_Base_ptr)0x0);
      }
      p_Var13 = &local_220._M_impl.super__Rb_tree_header;
      p_Var34 = p_Var13;
      if (((_Rb_tree_header *)p_Var14 != p_Var13) &&
         (p_Var34 = (_Rb_tree_header *)p_Var14,
         (int)p_Var36->_M_color < (int)((_Rb_tree_header *)p_Var14)->_M_node_count)) {
        p_Var34 = p_Var13;
      }
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                (&local_370,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_728
                );
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                (&local_388,
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(p_Var34 + 1));
      vectors_difference((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_618,
                         &local_370,&local_388);
      pVVar1 = pVStack_610;
      auVar11 = local_618;
      if (local_618 != (undefined1  [8])0x0) {
        operator_delete((void *)local_618,(long)local_608 - (long)local_618);
      }
      if (local_388.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_388.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_388.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_388.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_370.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_370.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_370.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_370.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((undefined1  [8])pVVar1 != auVar11) {
        pmVar21 = std::
                  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[]((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                                *)&local_220,(key_type *)p_Var36);
        bVar37 = true;
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                  (pmVar21,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_728)
        ;
      }
      if (local_728 != (undefined1  [8])0x0) {
        operator_delete((void *)local_728,(long)local_718 - (long)local_728);
      }
      p_Var36 = local_6a8;
      if (local_6f8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_6f8,(long)local_6e8 - (long)local_6f8);
      }
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
    } while (p_Var23 != p_Var36);
  } while (bVar37);
  local_710 = (_Rb_tree_node_base *)&pVStack_720;
  pVStack_720 = (VarId *)((ulong)pVStack_720 & 0xffffffff00000000);
  local_718 = (_Base_ptr)0x0;
  local_700 = 0;
  local_708 = local_710;
  if ((_Rb_tree_header *)local_1f0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_1f0._M_impl.super__Rb_tree_header) {
    p_Var14 = local_1f0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var22 = &local_250._M_impl.super__Rb_tree_header._M_header;
      if (local_250._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var29 = local_250._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if ((int)p_Var14[1]._M_color <= (int)*(size_t *)(p_Var29 + 1)) {
            p_Var22 = p_Var29;
          }
          p_Var29 = (&p_Var29->_M_left)[(int)*(size_t *)(p_Var29 + 1) < (int)p_Var14[1]._M_color];
        } while (p_Var29 != (_Base_ptr)0x0);
      }
      p_Var13 = &local_250._M_impl.super__Rb_tree_header;
      p_Var34 = p_Var13;
      if (((_Rb_tree_header *)p_Var22 != p_Var13) &&
         (p_Var34 = (_Rb_tree_header *)p_Var22,
         (int)p_Var14[1]._M_color < (int)((_Rb_tree_header *)p_Var22)->_M_node_count)) {
        p_Var34 = p_Var13;
      }
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                (&local_340,
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 &p_Var14[1]._M_parent);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                (&local_358,
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(p_Var34 + 1));
      vectors_intersection
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_618,&local_340
                 ,&local_358);
      local_6f8._0_4_ = p_Var14[1]._M_color;
      pVStack_6f0 = (VarId *)local_618;
      local_6e8 = pVStack_610;
      local_6e0 = local_608;
      local_618 = (undefined1  [8])0x0;
      pVStack_610 = (VarId *)0x0;
      local_608 = (_Base_ptr)0x0;
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
      ::
      _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                  *)local_728,
                 (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)local_6f8);
      if (pVStack_6f0 != (VarId *)0x0) {
        operator_delete(pVStack_6f0,(long)local_6e0 - (long)pVStack_6f0);
      }
      if (local_618 != (undefined1  [8])0x0) {
        operator_delete((void *)local_618,(long)local_608 - (long)local_618);
      }
      if (local_358.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_358.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_358.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_340.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.
                        super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_340.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_340.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
    } while ((_Rb_tree_header *)p_Var14 != &local_1f0._M_impl.super__Rb_tree_header);
  }
  p_Var36 = (_Rb_tree_node_base *)(local_6a0 + 8);
  *(_Rb_tree_color *)(local_6a0 + 8) = _S_red;
  *(_Base_ptr *)(local_6a0 + 0x10) = (_Base_ptr)0x0;
  *(_Rb_tree_node_base **)(local_6a0 + 0x18) = p_Var36;
  *(_Rb_tree_node_base **)(local_6a0 + 0x20) = p_Var36;
  *(size_t *)(local_6a0 + 0x28) = 0;
  if (local_710 != (_Rb_tree_node_base *)&pVStack_720) {
    p_Var23 = local_710;
    do {
      if ((p_Var23[1]._M_left != p_Var23[1]._M_parent) &&
         (p_Var23[1]._M_left != p_Var23[1]._M_parent)) {
        lVar35 = 8;
        uVar31 = 0;
        do {
          local_1c0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
          local_1c0.id = *(uint32_t *)((long)&(p_Var23[1]._M_parent)->_M_color + lVar35);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::_Rb_tree(&local_60,&local_1f0);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::_Rb_tree(&local_90,&local_1b0);
          blockHasVar((set<int,_std::less<int>,_std::allocator<int>_> *)local_618,&local_1c0,
                      (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)&local_60,
                      (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)&local_90);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::~_Rb_tree(&local_90);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::~_Rb_tree(&local_60);
          local_6f8 = (undefined1  [8])&PTR_display_001ee058;
          pVStack_6f0 = (VarId *)CONCAT44(pVStack_6f0._4_4_,
                                          *(undefined4 *)
                                           ((long)&(p_Var23[1]._M_parent)->_M_color + lVar35));
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &local_6e8,
                   (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_618);
          std::
          _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>>
          ::
          _M_insert_unique<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>
                    (local_6a0,
                     (pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
                      *)local_6f8);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )&local_6e8);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )local_618);
          uVar31 = uVar31 + 1;
          lVar35 = lVar35 + 0x10;
        } while (uVar31 < (ulong)((long)p_Var23[1]._M_left - (long)p_Var23[1]._M_parent >> 4));
      }
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
    } while (p_Var23 != (_Rb_tree_node_base *)&pVStack_720);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  poVar24 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar24,"*** desplay blocks ***",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar24 + -0x18) + (char)poVar24);
  std::ostream::put((char)poVar24);
  std::ostream::flush();
  for (p_Var23 = *(_Rb_tree_node_base **)(local_6a0 + 0x18); p_Var23 != p_Var36;
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23)) {
    (*(code *)**(undefined8 **)(p_Var23 + 1))(p_Var23 + 1,&std::cout);
    for (p_Var25 = p_Var23[2]._M_parent; p_Var25 != (_Rb_tree_node_base *)&p_Var23[1]._M_right;
        p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::operator<<(&std::cout,p_Var25[1]._M_color);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
               *)local_728);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_678);
  if (local_698 != (void *)0x0) {
    operator_delete(local_698,(long)local_688 - (long)local_698);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&local_250);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&local_220);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&local_1b0);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&local_1f0);
  return (map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          *)local_6a0;
}

Assistant:

map<mir::inst::VarId, set<int>> active_var(map<int, BasicBlock*> nodes) {
  map<int, vector<mir::inst::VarId>> def;
  map<int, vector<mir::inst::VarId>> use;
  map<int, vector<mir::inst::VarId>> in;
  map<int, vector<mir::inst::VarId>> out;
  BasicBlock* entry = find_entry(nodes);
  map<int, vector<mir::inst::VarId>>::iterator it;
  // step0: initialization
  map<int, BasicBlock*>::iterator iter;
  for (iter = nodes.begin(); iter != nodes.end(); iter++) {
    vector<mir::inst::VarId> v;
    def.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    use.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    in.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    out.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
  }
  // step1: Find the def and use variables for each block
  // BFS
  vector<int> visit;
  std::queue<int> q;
  visit.push_back(entry->id);
  q.push(entry->id);
  while (!q.empty()) {
    map<int, BasicBlock*>::iterator itt = nodes.find(q.front());
    BasicBlock* p = itt->second;
    q.pop();
    for (int i = 0; i < p->nextBlock.size(); i++) {
      vector<int>::iterator it =
          find(visit.begin(), visit.end(), p->nextBlock[i]->id);
      if (it == visit.end()) {
        vector<mir::inst::VarId> def1;
        vector<mir::inst::VarId> use1;
        for (int j = 0; j < p->nextBlock[i]->inst.size(); j++) {
          if (p->nextBlock[i]->inst[j].index() == 0) {
            shared_ptr<mir::inst::Inst> ins = get<0>(p->nextBlock[i]->inst[j]);
            if (ins->inst_kind() == mir::inst::InstKind::Assign) {
              shared_ptr<mir::inst::AssignInst> in =
                  std::static_pointer_cast<mir::inst::AssignInst>(ins);
              if (in->src.index() == 1) {
                if (!has_this(use1, get<1>(in->src)) &&
                    !has_this(def1, get<1>(in->src))) {
                  mir::inst::VarId s = get<1>(in->src);
                  use1.push_back(s);
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Op) {
              shared_ptr<mir::inst::OpInst> in =
                  std::static_pointer_cast<mir::inst::OpInst>(ins);
              if (in->lhs.index() == 1) {
                if (!has_this(use1, get<1>(in->lhs)) &&
                    !has_this(def1, get<1>(in->lhs))) {
                  use1.push_back(get<1>(in->lhs));
                }
              }
              if (in->rhs.index() == 1) {
                if (!has_this(use1, get<1>(in->rhs)) &&
                    !has_this(def1, get<1>(in->rhs))) {
                  use1.push_back(get<1>(in->rhs));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Call) {
              shared_ptr<mir::inst::CallInst> in =
                  std::static_pointer_cast<mir::inst::CallInst>(ins);
              for (int k = 0; k < in->params.size(); k++) {
                if (in->params[k].index() == 1) {
                  if (!has_this(use1, get<1>(in->params[k])) &&
                      !has_this(def1, get<1>(in->params[k]))) {
                    mir::inst::VarId s = get<1>(in->params[k]);
                    use1.push_back(s);
                  }
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Ref) {
              shared_ptr<mir::inst::RefInst> in =
                  std::static_pointer_cast<mir::inst::RefInst>(ins);
              if (in->val.index() == 0) {
                if (!has_this(use1, get<0>(in->val)) &&
                    !has_this(def1, get<0>(in->val))) {
                  use1.push_back(get<0>(in->val));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Load) {
              shared_ptr<mir::inst::LoadInst> in =
                  std::static_pointer_cast<mir::inst::LoadInst>(ins);
              if (in->src.index() == 1) {
                if (!has_this(use1, get<1>(in->src)) &&
                    !has_this(def1, get<1>(in->src))) {
                  use1.push_back(get<1>(in->src));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Store) {
              shared_ptr<mir::inst::StoreInst> in =
                  std::static_pointer_cast<mir::inst::StoreInst>(ins);
              if (in->val.index() == 1) {
                if (!has_this(use1, get<1>(in->val)) &&
                    !has_this(def1, get<1>(in->val))) {
                  use1.push_back(get<1>(in->val));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::PtrOffset) {
              shared_ptr<mir::inst::PtrOffsetInst> in =
                  std::static_pointer_cast<mir::inst::PtrOffsetInst>(ins);
              if (in->offset.index() == 1) {
                if (!has_this(use1, get<1>(in->offset)) &&
                    !has_this(def1, get<1>(in->offset))) {
                  use1.push_back(get<1>(in->offset));
                }
              }
              if (!has_this(use1, in->ptr) && !has_this(def1, in->ptr)) {
                use1.push_back(in->ptr);
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else {
              // nothing
            }
          } else if (p->nextBlock[i]->inst[j].index() == 1) {
            shared_ptr<mir::inst::JumpInstruction> ins =
                get<1>(p->nextBlock[i]->inst[j]);
            if (ins->kind == mir::inst::JumpInstructionKind::BrCond ||
                ins->kind == mir::inst::JumpInstructionKind::Return) {
              mir::inst::VarId var;
              if (ins->cond_or_ret && !has_this(use1, *ins->cond_or_ret) &&
                  !has_this(def1, *ins->cond_or_ret)) {
                use1.push_back(*ins->cond_or_ret);
              }
            }
          }
        }
        def[p->nextBlock[i]->id] = def1;
        use[p->nextBlock[i]->id] = use1;
        visit.push_back(p->nextBlock[i]->id);
        q.push(p->nextBlock[i]->id);
      }
    }
  }
  // output for test
  /*for (it = def.begin(); it != def.end(); it++) {
      cout << "def " << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }
  for (it = use.begin(); it != use .end(); it++) {
      cout << "use " << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step2: fill the in and out
  bool flag = true;
  while (flag) {
    flag = false;
    for (iter = nodes.begin(); iter != nodes.end(); iter++) {
      // cout << "|" << iter->second->id << endl;
      vector<mir::inst::VarId> _out = calcu_out(iter->second, in);
      out[iter->first] = _out;
      vector<mir::inst::VarId> _in = calcu_in(iter->first, use, out, def);
      it = in.find(iter->first);
      if (vectors_difference(_in, it->second).size() != 0) {
        flag = true;
        in[iter->first] = _in;
      }
    }
  }
  // output for test
  /*for (it = in.begin(); it != in.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }
  for (it = out.begin(); it != out.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step3: find the global var -- def && out
  map<int, vector<mir::inst::VarId>> global;
  for (it = def.begin(); it != def.end(); it++) {
    map<int, vector<mir::inst::VarId>>::iterator iter = out.find(it->first);
    global.insert(map<int, vector<mir::inst::VarId>>::value_type(
        it->first, vectors_intersection(it->second, iter->second)));
  }
  // output for test
  /*cout << endl << "*** desplay global var ***" << endl;
  for (it = global.begin(); it != global.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step4: build the blocks.
  map<mir::inst::VarId, set<int>> blocks;
  // mir::inst::VarId s0(0);
  for (it = global.begin(); it != global.end(); it++) {
    if (it->second.size() > 0) {
      for (int i = 0; i < it->second.size(); i++) {
        // if (it->second[i] != s0) {
        set<int> s = blockHasVar(it->second[i], def, use);
        blocks.insert(
            map<mir::inst::VarId, set<int>>::value_type(it->second[i], s));
        //}
      }
    }
  }
  cout << endl << "*** desplay blocks ***" << endl;
  map<mir::inst::VarId, set<int>>::iterator t;
  for (t = blocks.begin(); t != blocks.end(); t++) {
    cout << t->first;
    set<int>::iterator setit;
    for (setit = t->second.begin(); setit != t->second.end(); setit++) {
      cout << " " << *setit;
    }
    cout << endl;
  }
  return blocks;
}